

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O3

int IDAGetNumJTSetupEvals(void *ida_mem,long *njtsetups)

{
  int iVar1;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDALsMem local_18;
  IDAMem local_10;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDAGetNumJTSetupEvals",&local_10,&local_18);
  if (iVar1 == 0) {
    *njtsetups = local_18->njtsetup;
  }
  return iVar1;
}

Assistant:

int IDAGetNumJTSetupEvals(void* ida_mem, long int* njtsetups)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure; store output and return */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }
  *njtsetups = idals_mem->njtsetup;
  return (IDALS_SUCCESS);
}